

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtreeview.cpp
# Opt level: O0

void __thiscall QTreeViewPrivate::updateScrollBars(QTreeViewPrivate *this)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  QTreeView *pQVar5;
  qsizetype qVar6;
  int *piVar7;
  QTreeViewPrivate *in_RDI;
  long in_FS_OFFSET;
  int horizontalLength;
  int logical;
  int column;
  int width;
  int viewportWidth;
  int columnCount;
  int i;
  int contentsHeight;
  int item;
  int height;
  int viewportHeight;
  int itemsCount;
  QTreeView *q;
  QSize maxSize;
  int columnsInViewport;
  int itemsInViewport;
  QSize viewportSize;
  QWidget *in_stack_ffffffffffffff18;
  int step;
  undefined4 in_stack_ffffffffffffff20;
  int in_stack_ffffffffffffff24;
  QHeaderView *in_stack_ffffffffffffff28;
  QSize *in_stack_ffffffffffffff30;
  int in_stack_ffffffffffffff38;
  int in_stack_ffffffffffffff3c;
  QScrollBar *in_stack_ffffffffffffff40;
  int local_80;
  int local_7c;
  int local_70;
  int local_6c;
  int local_68;
  int local_64;
  int local_48;
  int local_44 [3];
  QSize local_38;
  int local_30;
  int local_2c [3];
  int local_20;
  int local_1c;
  QSize local_18;
  QSize local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar5 = q_func(in_RDI);
  local_10 = (QSize)&DAT_aaaaaaaaaaaaaaaa;
  local_10 = QWidget::size(in_stack_ffffffffffffff18);
  bVar1 = QSize::isValid(in_stack_ffffffffffffff30);
  if (!bVar1) {
    QSize::QSize((QSize *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
                 (int)((ulong)in_stack_ffffffffffffff18 >> 0x20),(int)in_stack_ffffffffffffff18);
    local_10 = local_18;
  }
  QAbstractItemViewPrivate::executePostedLayout
            ((QAbstractItemViewPrivate *)
             CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20));
  bVar1 = QList<QTreeViewItem>::isEmpty((QList<QTreeViewItem> *)0x8f1016);
  if (bVar1) {
    (**(code **)(*(long *)&(pQVar5->super_QAbstractItemView).super_QAbstractScrollArea.super_QFrame.
                           super_QWidget + 0x220))();
  }
  local_1c = 0;
  if ((in_RDI->uniformRowHeights & 1U) == 0) {
    qVar6 = QList<QTreeViewItem>::size(&in_RDI->viewItems);
    local_68 = (int)qVar6;
    iVar2 = QSize::height((QSize *)0x8f10b8);
    local_64 = 0;
    while (local_68 = local_68 + -1, -1 < local_68) {
      iVar3 = itemHeight((QTreeViewPrivate *)
                         CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38),
                         (int)((ulong)in_stack_ffffffffffffff30 >> 0x20));
      local_64 = iVar3 + local_64;
      if (iVar2 < local_64) break;
      local_1c = local_1c + 1;
    }
  }
  else if (in_RDI->defaultItemHeight < 1) {
    qVar6 = QList<QTreeViewItem>::size(&in_RDI->viewItems);
    local_1c = (int)qVar6;
  }
  else {
    local_1c = QSize::height((QSize *)0x8f107b);
    local_1c = local_1c / in_RDI->defaultItemHeight;
  }
  if ((in_RDI->super_QAbstractItemViewPrivate).verticalScrollMode == ScrollPerItem) {
    bVar1 = QList<QTreeViewItem>::isEmpty((QList<QTreeViewItem> *)0x8f115f);
    local_6c = in_stack_ffffffffffffff3c;
    if (!bVar1) {
      local_20 = 1;
      piVar7 = qMax<int>(&local_20,&local_1c);
      local_1c = *piVar7;
      local_6c = in_stack_ffffffffffffff3c;
    }
    QList<QTreeViewItem>::size(&in_RDI->viewItems);
    QAbstractSlider::setRange
              ((QAbstractSlider *)in_stack_ffffffffffffff30,local_6c,in_stack_ffffffffffffff38);
    QAbstractSlider::setPageStep
              ((QAbstractSlider *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
               (int)((ulong)in_stack_ffffffffffffff18 >> 0x20));
    QAbstractSlider::setSingleStep
              ((QAbstractSlider *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
               (int)((ulong)in_stack_ffffffffffffff18 >> 0x20));
  }
  else {
    local_6c = 0;
    if ((in_RDI->uniformRowHeights & 1U) == 0) {
      for (local_70 = 0; qVar6 = QList<QTreeViewItem>::size(&in_RDI->viewItems), local_70 < qVar6;
          local_70 = local_70 + 1) {
        iVar2 = itemHeight((QTreeViewPrivate *)
                           CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38),
                           (int)((ulong)in_stack_ffffffffffffff30 >> 0x20));
        local_6c = iVar2 + local_6c;
      }
    }
    else {
      local_6c = in_RDI->defaultItemHeight;
      qVar6 = QList<QTreeViewItem>::size(&in_RDI->viewItems);
      local_6c = local_6c * (int)qVar6;
    }
    in_stack_ffffffffffffff40 =
         (in_RDI->super_QAbstractItemViewPrivate).super_QAbstractScrollAreaPrivate.vbar;
    QSize::height((QSize *)0x8f12b5);
    QAbstractSlider::setRange
              ((QAbstractSlider *)in_stack_ffffffffffffff30,local_6c,in_stack_ffffffffffffff38);
    QSize::height((QSize *)0x8f12e5);
    QAbstractSlider::setPageStep
              ((QAbstractSlider *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
               (int)((ulong)in_stack_ffffffffffffff18 >> 0x20));
    QScrollBar::d_func((QScrollBar *)0x8f1302);
    local_2c[2] = QSize::height((QSize *)0x8f1314);
    local_2c[2] = local_2c[2] / (local_1c + 1);
    local_2c[1] = 2;
    qMax<int>(local_2c + 2,local_2c + 1);
    QAbstractSliderPrivate::itemviewChangeSingleStep
              ((QAbstractSliderPrivate *)
               CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
               (int)((ulong)in_stack_ffffffffffffff18 >> 0x20));
  }
  iVar2 = QHeaderView::count((QHeaderView *)
                             CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20));
  iVar3 = QSize::width((QSize *)0x8f1376);
  local_2c[0] = 0;
  local_7c = 0;
  local_80 = iVar2;
  while( true ) {
    step = (int)((ulong)in_stack_ffffffffffffff18 >> 0x20);
    local_80 = local_80 + -1;
    if (local_80 < 0) break;
    QHeaderView::logicalIndex(in_stack_ffffffffffffff28,in_stack_ffffffffffffff24);
    iVar4 = QHeaderView::sectionSize
                      ((QHeaderView *)CONCAT44(local_6c,in_stack_ffffffffffffff38),
                       (int)((ulong)in_stack_ffffffffffffff30 >> 0x20));
    step = (int)((ulong)in_stack_ffffffffffffff18 >> 0x20);
    local_7c = iVar4 + local_7c;
    if (iVar3 < local_7c) break;
    local_2c[0] = local_2c[0] + 1;
  }
  if (0 < iVar2) {
    local_30 = 1;
    piVar7 = qMax<int>(&local_30,local_2c);
    local_2c[0] = *piVar7;
  }
  if ((in_RDI->super_QAbstractItemViewPrivate).horizontalScrollMode == ScrollPerItem) {
    QAbstractSlider::setRange
              ((QAbstractSlider *)in_stack_ffffffffffffff30,local_6c,in_stack_ffffffffffffff38);
    QAbstractSlider::setPageStep
              ((QAbstractSlider *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),step
              );
    QAbstractSlider::setSingleStep
              ((QAbstractSlider *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),step
              );
  }
  else {
    iVar2 = QHeaderView::length((QHeaderView *)
                                CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20));
    local_38 = (QSize)&DAT_aaaaaaaaaaaaaaaa;
    local_38 = QAbstractScrollArea::maximumViewportSize
                         ((QAbstractScrollArea *)in_stack_ffffffffffffff40);
    iVar3 = QSize::width((QSize *)0x8f14d6);
    if ((iVar2 <= iVar3) &&
       (iVar3 = QAbstractSlider::maximum
                          ((QAbstractSlider *)
                           CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20)), iVar3 < 1
       )) {
      local_10 = local_38;
    }
    iVar3 = (int)((ulong)(in_RDI->super_QAbstractItemViewPrivate).super_QAbstractScrollAreaPrivate.
                         hbar >> 0x20);
    QSize::width((QSize *)0x8f151f);
    QAbstractSlider::setPageStep
              ((QAbstractSlider *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
               iVar3);
    local_44[2] = QSize::width((QSize *)0x8f1550);
    local_44[2] = iVar2 - local_44[2];
    local_44[1] = 0;
    qMax<int>(local_44 + 2,local_44 + 1);
    QAbstractSlider::setRange
              ((QAbstractSlider *)in_stack_ffffffffffffff30,local_6c,in_stack_ffffffffffffff38);
    QScrollBar::d_func((QScrollBar *)0x8f159e);
    local_44[0] = QSize::width((QSize *)0x8f15b0);
    local_44[0] = local_44[0] / (local_2c[0] + 1);
    local_48 = 2;
    qMax<int>(local_44,&local_48);
    QAbstractSliderPrivate::itemviewChangeSingleStep
              ((QAbstractSliderPrivate *)CONCAT44(iVar2,in_stack_ffffffffffffff20),iVar3);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QTreeViewPrivate::updateScrollBars()
{
    Q_Q(QTreeView);
    QSize viewportSize = viewport->size();
    if (!viewportSize.isValid())
        viewportSize = QSize(0, 0);

    executePostedLayout();
    if (viewItems.isEmpty()) {
        q->doItemsLayout();
    }

    int itemsInViewport = 0;
    if (uniformRowHeights) {
        if (defaultItemHeight <= 0)
            itemsInViewport = viewItems.size();
        else
            itemsInViewport = viewportSize.height() / defaultItemHeight;
    } else {
        const int itemsCount = viewItems.size();
        const int viewportHeight = viewportSize.height();
        for (int height = 0, item = itemsCount - 1; item >= 0; --item) {
            height += itemHeight(item);
            if (height > viewportHeight)
                break;
            ++itemsInViewport;
        }
    }
    if (verticalScrollMode == QAbstractItemView::ScrollPerItem) {
        if (!viewItems.isEmpty())
            itemsInViewport = qMax(1, itemsInViewport);
        vbar->setRange(0, viewItems.size() - itemsInViewport);
        vbar->setPageStep(itemsInViewport);
        vbar->setSingleStep(1);
    } else { // scroll per pixel
        int contentsHeight = 0;
        if (uniformRowHeights) {
            contentsHeight = defaultItemHeight * viewItems.size();
        } else { // ### (maybe do like QHeaderView by letting items have startposition)
            for (int i = 0; i < viewItems.size(); ++i)
                contentsHeight += itemHeight(i);
        }
        vbar->setRange(0, contentsHeight - viewportSize.height());
        vbar->setPageStep(viewportSize.height());
        vbar->d_func()->itemviewChangeSingleStep(qMax(viewportSize.height() / (itemsInViewport + 1), 2));
    }

    const int columnCount = header->count();
    const int viewportWidth = viewportSize.width();
    int columnsInViewport = 0;
    for (int width = 0, column = columnCount - 1; column >= 0; --column) {
        int logical = header->logicalIndex(column);
        width += header->sectionSize(logical);
        if (width > viewportWidth)
            break;
        ++columnsInViewport;
    }
    if (columnCount > 0)
        columnsInViewport = qMax(1, columnsInViewport);
    if (horizontalScrollMode == QAbstractItemView::ScrollPerItem) {
        hbar->setRange(0, columnCount - columnsInViewport);
        hbar->setPageStep(columnsInViewport);
        hbar->setSingleStep(1);
    } else { // scroll per pixel
        const int horizontalLength = header->length();
        const QSize maxSize = q->maximumViewportSize();
        if (maxSize.width() >= horizontalLength && vbar->maximum() <= 0)
            viewportSize = maxSize;
        hbar->setPageStep(viewportSize.width());
        hbar->setRange(0, qMax(horizontalLength - viewportSize.width(), 0));
        hbar->d_func()->itemviewChangeSingleStep(qMax(viewportSize.width() / (columnsInViewport + 1), 2));
    }
}